

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Orphan<capnp::compiler::Expression>_> * __thiscall
kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::operator=
          (NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *this,
          NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other)

{
  Orphan<capnp::compiler::Expression> *params;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *other_local;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Orphan<capnp::compiler::Expression>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Orphan<capnp::compiler::Expression>>(&(other->field_1).value);
      ctor<capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }